

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O2

int __thiscall ezc3d::ParametersNS::Parameters::remove(Parameters *this,char *__filename)

{
  pointer pGVar1;
  long lVar2;
  iterator iVar3;
  out_of_range *this_00;
  string sStack_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pGVar1 = (this->_groups).
           super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->_groups).
                super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1;
  if (__filename < (char *)(lVar2 / 0x60)) {
    iVar3 = std::
            vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
            ::erase(&this->_groups,pGVar1 + (long)__filename);
    return (int)iVar3._M_current;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10,pGVar1,lVar2 % 0x60);
  std::__cxx11::to_string(&local_c8,(unsigned_long)__filename);
  std::operator+(&local_a8,"Parameters::group method is trying to access the group ",&local_c8);
  std::operator+(&local_88,&local_a8," while the maximum number of groups is ");
  std::__cxx11::to_string
            (&sStack_e8,
             ((long)(this->_groups).
                    super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_groups).
                   super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x60);
  std::operator+(&local_68,&local_88,&sStack_e8);
  std::operator+(&local_48,&local_68,".");
  std::out_of_range::out_of_range(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void ezc3d::ParametersNS::Parameters::remove(size_t idx) {
  if (idx >= nbGroups()) {
    throw std::out_of_range(
        "Parameters::group method is trying to access the group " +
        std::to_string(idx) + " while the maximum number of groups is " +
        std::to_string(nbGroups()) + ".");
  }
  _groups.erase(_groups.begin() + idx);
}